

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_decoder.h
# Opt level: O0

lzma_ret rc_read_init(lzma_range_decoder *rc,uint8_t *in,size_t *in_pos,size_t in_size)

{
  size_t in_size_local;
  size_t *in_pos_local;
  uint8_t *in_local;
  lzma_range_decoder *rc_local;
  
  while( true ) {
    if (rc->init_bytes_left == 0) {
      return LZMA_STREAM_END;
    }
    if (*in_pos == in_size) break;
    if ((rc->init_bytes_left == 5) && (in[*in_pos] != '\0')) {
      return LZMA_DATA_ERROR;
    }
    rc->code = rc->code << 8 | (uint)in[*in_pos];
    *in_pos = *in_pos + 1;
    rc->init_bytes_left = rc->init_bytes_left - 1;
  }
  return LZMA_OK;
}

Assistant:

static inline lzma_ret
rc_read_init(lzma_range_decoder *rc, const uint8_t *restrict in,
		size_t *restrict in_pos, size_t in_size)
{
	while (rc->init_bytes_left > 0) {
		if (*in_pos == in_size)
			return LZMA_OK;

		// The first byte is always 0x00. It could have been omitted
		// in LZMA2 but it wasn't, so one byte is wasted in every
		// LZMA2 chunk.
		if (rc->init_bytes_left == 5 && in[*in_pos] != 0x00)
			return LZMA_DATA_ERROR;

		rc->code = (rc->code << 8) | in[*in_pos];
		++*in_pos;
		--rc->init_bytes_left;
	}

	return LZMA_STREAM_END;
}